

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O1

int mbedtls_mpi_core_random
              (mbedtls_mpi_uint *X,mbedtls_mpi_uint min,mbedtls_mpi_uint *N,size_t limbs,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  ulong uVar2;
  mbedtls_ct_condition_t mVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  int iVar9;
  
  uVar5 = 0;
  uVar7 = limbs & 0xffffffff;
  lVar4 = uVar7 * 0x40 + 0x40;
  do {
    if ((int)uVar7 < 1) goto LAB_001b98c0;
    uVar2 = N[uVar7 - 1];
    uVar7 = uVar7 - 1;
    lVar4 = lVar4 + -0x40;
  } while (uVar2 == 0);
  uVar5 = 0x3f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar5 = lVar4 - (uVar5 ^ 0x3f);
LAB_001b98c0:
  iVar9 = 0xfa;
  if (0x20 < uVar5) {
    iVar9 = 0x1e;
  }
  while( true ) {
    iVar1 = mbedtls_mpi_core_fill_random(X,limbs,uVar5 + 7 >> 3,f_rng,p_rng);
    if (iVar1 != 0) {
      return iVar1;
    }
    mbedtls_mpi_core_shift_r(X,limbs,(uVar5 + 7 & 0x3ffffffff8) - uVar5);
    iVar9 = iVar9 + -1;
    if (iVar9 == 0) break;
    uVar7 = *X;
    uVar2 = uVar7 ^ min;
    uVar6 = 0;
    if (1 < limbs) {
      sVar8 = 1;
      do {
        uVar6 = uVar6 | (long)(-X[sVar8] | X[sVar8]) >> 0x3f;
        sVar8 = sVar8 + 1;
      } while (limbs != sVar8);
    }
    mVar3 = mbedtls_mpi_core_lt_ct(X,N,limbs);
    if ((mVar3 & (~((long)(uVar7 - min & ~uVar2 | min & uVar2) >> 0x3f) | uVar6)) != 0) {
      return 0;
    }
  }
  return -0xe;
}

Assistant:

int mbedtls_mpi_core_random(mbedtls_mpi_uint *X,
                            mbedtls_mpi_uint min,
                            const mbedtls_mpi_uint *N,
                            size_t limbs,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng)
{
    mbedtls_ct_condition_t ge_lower = MBEDTLS_CT_TRUE, lt_upper = MBEDTLS_CT_FALSE;
    size_t n_bits = mbedtls_mpi_core_bitlen(N, limbs);
    size_t n_bytes = (n_bits + 7) / 8;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /*
     * When min == 0, each try has at worst a probability 1/2 of failing
     * (the msb has a probability 1/2 of being 0, and then the result will
     * be < N), so after 30 tries failure probability is a most 2**(-30).
     *
     * When N is just below a power of 2, as is the case when generating
     * a random scalar on most elliptic curves, 1 try is enough with
     * overwhelming probability. When N is just above a power of 2,
     * as when generating a random scalar on secp224k1, each try has
     * a probability of failing that is almost 1/2.
     *
     * The probabilities are almost the same if min is nonzero but negligible
     * compared to N. This is always the case when N is crypto-sized, but
     * it's convenient to support small N for testing purposes. When N
     * is small, use a higher repeat count, otherwise the probability of
     * failure is macroscopic.
     */
    int count = (n_bytes > 4 ? 30 : 250);

    /*
     * Match the procedure given in RFC 6979 §3.3 (deterministic ECDSA)
     * when f_rng is a suitably parametrized instance of HMAC_DRBG:
     * - use the same byte ordering;
     * - keep the leftmost n_bits bits of the generated octet string;
     * - try until result is in the desired range.
     * This also avoids any bias, which is especially important for ECDSA.
     */
    do {
        MBEDTLS_MPI_CHK(mbedtls_mpi_core_fill_random(X, limbs,
                                                     n_bytes,
                                                     f_rng, p_rng));
        mbedtls_mpi_core_shift_r(X, limbs, 8 * n_bytes - n_bits);

        if (--count == 0) {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            goto cleanup;
        }

        ge_lower = mbedtls_mpi_core_uint_le_mpi(min, X, limbs);
        lt_upper = mbedtls_mpi_core_lt_ct(X, N, limbs);
    } while (mbedtls_ct_bool_and(ge_lower, lt_upper) == MBEDTLS_CT_FALSE);

cleanup:
    return ret;
}